

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3BtreeInsert(BtCursor *pCur,BtreePayload *pX,int flags,int seekResult)

{
  ushort uVar1;
  Btree *pBtree;
  long lVar2;
  BtShared *pBt;
  BtreePayload *pBVar3;
  int iVar4;
  Pgno PVar5;
  byte bVar6;
  Pgno PVar7;
  u8 *puVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  MemPage *pMVar12;
  int iVar13;
  uint uVar14;
  u64 v;
  u8 *__dest;
  uchar *pCell;
  uint uVar15;
  void *pvVar16;
  int local_c8;
  int loc;
  Pgno local_c0;
  uint local_bc;
  u8 *local_b8;
  uint local_ac;
  int local_a8;
  int rc;
  MemPage *local_a0;
  uint local_94;
  uint *local_90;
  BtShared *local_88;
  BtreePayload *local_80;
  MemPage *local_78;
  BtShared *local_70;
  BtCursor *local_68;
  BtreePayload x2;
  
  if (pCur->eState == '\x04') {
    return pCur->skipNext;
  }
  pBtree = pCur->pBtree;
  local_70 = pBtree->pBt;
  loc = seekResult;
  if (((pCur->curFlags & 0x20) != 0) &&
     (local_c8 = saveAllCursors(local_70,pCur->pgnoRoot,pCur), local_c8 != 0)) {
    return local_c8;
  }
  if (pCur->pKeyInfo == (KeyInfo *)0x0) {
    invalidateIncrblobCursors(pBtree,pCur->pgnoRoot,pX->nKey,0);
    if (((pCur->curFlags & 2) == 0) || (pX->nKey != (pCur->info).nKey)) {
      if ((seekResult == 0) &&
         (local_c8 = sqlite3BtreeMovetoUnpacked
                               (pCur,(UnpackedRecord *)0x0,pX->nKey,(uint)(flags != 0),&loc),
         local_c8 != 0)) {
        return local_c8;
      }
    }
    else if (((pCur->info).nSize != 0) && ((pCur->info).nPayload == pX->nZero + pX->nData)) {
      iVar4 = btreeOverwriteCell(pCur,pX);
      return iVar4;
    }
  }
  else {
    if ((flags & 2U) == 0 && seekResult == 0) {
      if (pX->nMem == 0) {
        iVar4 = btreeMoveto(pCur,pX->pKey,pX->nKey,(uint)(flags != 0),&loc);
      }
      else {
        x2.nKey = (sqlite3_int64)pX->aMem;
        x2.pData._0_7_ = CONCAT52(0,pX->nMem);
        x2.pKey = pCur->pKeyInfo;
        iVar4 = sqlite3BtreeMovetoUnpacked(pCur,(UnpackedRecord *)&x2,0,(uint)(flags != 0),&loc);
      }
      if (iVar4 != 0) {
        return iVar4;
      }
      local_c8 = 0;
      seekResult = loc;
    }
    if (seekResult == 0) {
      getCellInfo(pCur);
      lVar2 = (pCur->info).nKey;
      if (lVar2 == pX->nKey) {
        x2.pData = pX->pKey;
        x2.nData = (int)lVar2;
        x2.nZero = 0;
        iVar4 = btreeOverwriteCell(pCur,&x2);
        return iVar4;
      }
    }
  }
  pMVar12 = pCur->pPage;
  if (pMVar12->nFree < 0) {
    iVar4 = btreeComputeFreeSpace(pMVar12);
    if (iVar4 != 0) {
      return iVar4;
    }
    local_c8 = 0;
  }
  puVar8 = local_70->pTmpSpace;
  bVar6 = pMVar12->childPtrSize;
  local_b8 = puVar8;
  local_a8 = flags;
  local_80 = pX;
  local_78 = pMVar12;
  if (pMVar12->intKey == '\0') {
    pvVar16 = pX->pKey;
    uVar10 = pX->nKey;
    if ((uint)uVar10 < 0x80) {
      puVar8[bVar6] = (u8)uVar10;
      uVar11 = 1;
    }
    else {
      uVar11 = sqlite3PutVarint(puVar8 + bVar6,(long)(int)(uint)uVar10);
      uVar11 = uVar11 & 0xff;
    }
    iVar4 = uVar11 + bVar6;
    v = uVar10 & 0xffffffff;
    puVar8 = local_b8;
  }
  else {
    uVar10 = (ulong)pX->nData;
    v = (long)pX->nZero + uVar10;
    pvVar16 = pX->pData;
    if ((uint)v < 0x80) {
      uVar11 = 1;
      puVar8[bVar6] = (u8)v;
    }
    else {
      uVar11 = sqlite3PutVarint(puVar8 + bVar6,v);
      uVar11 = uVar11 & 0xff;
    }
    iVar4 = sqlite3PutVarint(puVar8 + (uVar11 + bVar6),local_80->nKey);
    iVar4 = iVar4 + uVar11 + bVar6;
  }
  __dest = puVar8 + iVar4;
  iVar13 = (int)v;
  if ((int)(uint)local_78->maxLocal < iVar13) {
    uVar1 = local_78->minLocal;
    local_88 = local_78->pBt;
    local_a0 = (MemPage *)0x0;
    uVar11 = (iVar13 - (uint)uVar1) % (local_88->usableSize - 4) + (uint)uVar1;
    if ((int)(uint)local_78->maxLocal < (int)uVar11) {
      uVar11 = (uint)uVar1;
    }
    local_bc = iVar4 + uVar11 + 4;
    local_c0 = 0;
    local_90 = (uint *)(puVar8 + (int)(uVar11 + iVar4));
    local_68 = pCur;
    while( true ) {
      uVar14 = (uint)v;
      uVar15 = uVar11;
      if ((int)uVar14 < (int)uVar11) {
        uVar15 = uVar14;
      }
      uVar9 = (uint)uVar10;
      if ((int)uVar9 < (int)uVar15) {
        if ((int)uVar9 < 1) {
          memset(__dest,0,(long)(int)uVar15);
        }
        else {
          memcpy(__dest,pvVar16,uVar10 & 0xffffffff);
          uVar15 = uVar9;
        }
      }
      else {
        memcpy(__dest,pvVar16,(long)(int)uVar15);
      }
      pBt = local_88;
      v = (u64)(uVar14 - uVar15);
      if (uVar14 - uVar15 == 0 || (int)uVar14 < (int)uVar15) break;
      __dest = __dest + (int)uVar15;
      pvVar16 = (void *)((long)pvVar16 + (long)(int)uVar15);
      uVar10 = (ulong)(uVar9 - uVar15);
      uVar11 = uVar11 - uVar15;
      if (uVar11 == 0) {
        x2.pKey = (void *)0x0;
        local_ac = local_c0;
        if (local_88->autoVacuum != '\0') {
          local_94 = sqlite3PendingByte;
          PVar7 = local_c0;
          do {
            do {
              uVar11 = PVar7;
              PVar7 = uVar11 + 1;
              PVar5 = ptrmapPageno(pBt,PVar7);
            } while (PVar7 == PVar5);
          } while (uVar11 == local_94 / pBt->pageSize);
          local_c0 = uVar11 + 1;
        }
        iVar4 = allocateBtreePage(pBt,(MemPage **)&x2,&local_c0,local_c0,'\0');
        PVar7 = local_c0;
        rc = iVar4;
        if ((pBt->autoVacuum == '\0') || (iVar4 != 0)) {
          pMVar12 = local_a0;
          if (iVar4 != 0) goto LAB_0016d6f1;
        }
        else {
          ptrmapPut(pBt,local_c0,'\x04' - (local_ac == 0),local_ac,&rc);
          pMVar12 = local_a0;
          iVar4 = rc;
          if (rc != 0) {
            releasePage((MemPage *)x2.pKey);
LAB_0016d6f1:
            releasePage(pMVar12);
            return iVar4;
          }
        }
        *local_90 = PVar7 >> 0x18 | (PVar7 & 0xff0000) >> 8 | (PVar7 & 0xff00) << 8 | PVar7 << 0x18;
        releasePage(local_a0);
        local_a0 = (MemPage *)x2.pKey;
        local_90 = *(uint **)((long)x2.pKey + 0x50);
        *local_90 = 0;
        __dest = (u8 *)(*(long *)((long)x2.pKey + 0x50) + 4);
        uVar11 = local_88->usableSize - 4;
      }
    }
    releasePage(local_a0);
    pCur = local_68;
    uVar11 = local_bc;
  }
  else {
    uVar11 = 4;
    if (4 < iVar4 + iVar13) {
      uVar11 = iVar4 + iVar13;
    }
    iVar4 = (int)uVar10;
    memcpy(__dest,pvVar16,(long)iVar4);
    memset(__dest + iVar4,0,(long)(iVar13 - iVar4));
  }
  pMVar12 = local_78;
  pBVar3 = local_80;
  local_c8 = 0;
  uVar1 = pCur->ix;
  uVar15 = (uint)uVar1;
  bVar6 = (byte)local_a8;
  if (loc == 0) {
    local_bc = uVar11;
    iVar4 = sqlite3PagerWrite(local_78->pDbPage);
    if (iVar4 != 0) {
      return iVar4;
    }
    pCell = pMVar12->aData +
            (CONCAT11(pMVar12->aCellIdx[(ulong)uVar1 * 2],pMVar12->aCellIdx[(ulong)uVar1 * 2 + 1]) &
            pMVar12->maskPage);
    if (pMVar12->leaf == '\0') {
      *(undefined4 *)local_b8 = *(undefined4 *)pCell;
    }
    local_c8 = clearCell(pMVar12,pCell,(CellInfo *)&x2);
    if (local_bc == x2.pData._6_2_) {
      if (((uint)x2.pData == x2.pData._4_2_) &&
         ((local_70->autoVacuum == '\0' || (local_bc < pMVar12->minLocal)))) {
        if (pMVar12->aDataEnd < pCell + local_bc) {
          iVar4 = sqlite3CorruptError(0x11931);
          return iVar4;
        }
        memcpy(pCell,local_b8,(ulong)local_bc);
        return 0;
      }
    }
    dropCell(pMVar12,(uint)uVar1,(uint)x2.pData._6_2_,&local_c8);
    bVar6 = (byte)local_a8;
    uVar11 = local_bc;
    if (local_c8 != 0) {
      return local_c8;
    }
  }
  else if ((loc < 0) && (local_78->nCell != 0)) {
    pCur->ix = uVar1 + 1;
    uVar15 = (uint)(ushort)(uVar1 + 1);
    pCur->curFlags = pCur->curFlags & 0xfd;
  }
  insertCell(pMVar12,uVar15,local_b8,uVar11,(u8 *)0x0,0,&local_c8);
  (pCur->info).nSize = 0;
  iVar4 = local_c8;
  if (pMVar12->nOverflow != '\0') {
    pCur->curFlags = pCur->curFlags & 0xfd;
    iVar4 = balance(pCur);
    pCur->pPage->nOverflow = '\0';
    pCur->eState = '\x01';
    if ((iVar4 == 0 & bVar6 >> 1) == 1) {
      btreeReleaseAllCursorPages(pCur);
      iVar4 = 0;
      if (pCur->pKeyInfo != (KeyInfo *)0x0) {
        pvVar16 = sqlite3Malloc(pBVar3->nKey);
        pCur->pKey = pvVar16;
        if (pvVar16 == (void *)0x0) {
          iVar4 = 7;
        }
        else {
          memcpy(pvVar16,pBVar3->pKey,pBVar3->nKey);
        }
      }
      pCur->eState = '\x03';
      pCur->nKey = pBVar3->nKey;
    }
  }
  return iVar4;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeInsert(
  BtCursor *pCur,                /* Insert data into the table of this cursor */
  const BtreePayload *pX,        /* Content of the row to be inserted */
  int flags,                     /* True if this is likely an append */
  int seekResult                 /* Result of prior MovetoUnpacked() call */
){
  int rc;
  int loc = seekResult;          /* -1: before desired location  +1: after */
  int szNew = 0;
  int idx;
  MemPage *pPage;
  Btree *p = pCur->pBtree;
  BtShared *pBt = p->pBt;
  unsigned char *oldCell;
  unsigned char *newCell = 0;

  assert( (flags & (BTREE_SAVEPOSITION|BTREE_APPEND))==flags );

  if( pCur->eState==CURSOR_FAULT ){
    assert( pCur->skipNext!=SQLITE_OK );
    return pCur->skipNext;
  }

  assert( cursorOwnsBtShared(pCur) );
  assert( (pCur->curFlags & BTCF_WriteFlag)!=0
              && pBt->inTransaction==TRANS_WRITE
              && (pBt->btsFlags & BTS_READ_ONLY)==0 );
  assert( hasSharedCacheTableLock(p, pCur->pgnoRoot, pCur->pKeyInfo!=0, 2) );

  /* Assert that the caller has been consistent. If this cursor was opened
  ** expecting an index b-tree, then the caller should be inserting blob
  ** keys with no associated data. If the cursor was opened expecting an
  ** intkey table, the caller should be inserting integer keys with a
  ** blob of associated data.  */
  assert( (pX->pKey==0)==(pCur->pKeyInfo==0) );

  /* Save the positions of any other cursors open on this table.
  **
  ** In some cases, the call to btreeMoveto() below is a no-op. For
  ** example, when inserting data into a table with auto-generated integer
  ** keys, the VDBE layer invokes sqlite3BtreeLast() to figure out the 
  ** integer key to use. It then calls this function to actually insert the 
  ** data into the intkey B-Tree. In this case btreeMoveto() recognizes
  ** that the cursor is already where it needs to be and returns without
  ** doing any work. To avoid thwarting these optimizations, it is important
  ** not to clear the cursor here.
  */
  if( pCur->curFlags & BTCF_Multiple ){
    rc = saveAllCursors(pBt, pCur->pgnoRoot, pCur);
    if( rc ) return rc;
  }

  if( pCur->pKeyInfo==0 ){
    assert( pX->pKey==0 );
    /* If this is an insert into a table b-tree, invalidate any incrblob 
    ** cursors open on the row being replaced */
    invalidateIncrblobCursors(p, pCur->pgnoRoot, pX->nKey, 0);

    /* If BTREE_SAVEPOSITION is set, the cursor must already be pointing 
    ** to a row with the same key as the new entry being inserted.
    */
#ifdef SQLITE_DEBUG
    if( flags & BTREE_SAVEPOSITION ){
      assert( pCur->curFlags & BTCF_ValidNKey );
      assert( pX->nKey==pCur->info.nKey );
      assert( pCur->info.nSize!=0 );
      assert( loc==0 );
    }
#endif

    /* On the other hand, BTREE_SAVEPOSITION==0 does not imply
    ** that the cursor is not pointing to a row to be overwritten.
    ** So do a complete check.
    */
    if( (pCur->curFlags&BTCF_ValidNKey)!=0 && pX->nKey==pCur->info.nKey ){
      /* The cursor is pointing to the entry that is to be
      ** overwritten */
      assert( pX->nData>=0 && pX->nZero>=0 );
      if( pCur->info.nSize!=0
       && pCur->info.nPayload==(u32)pX->nData+pX->nZero
      ){
        /* New entry is the same size as the old.  Do an overwrite */
        return btreeOverwriteCell(pCur, pX);
      }
      assert( loc==0 );
    }else if( loc==0 ){
      /* The cursor is *not* pointing to the cell to be overwritten, nor
      ** to an adjacent cell.  Move the cursor so that it is pointing either
      ** to the cell to be overwritten or an adjacent cell.
      */
      rc = sqlite3BtreeMovetoUnpacked(pCur, 0, pX->nKey, flags!=0, &loc);
      if( rc ) return rc;
    }
  }else{
    /* This is an index or a WITHOUT ROWID table */

    /* If BTREE_SAVEPOSITION is set, the cursor must already be pointing 
    ** to a row with the same key as the new entry being inserted.
    */
    assert( (flags & BTREE_SAVEPOSITION)==0 || loc==0 );

    /* If the cursor is not already pointing either to the cell to be
    ** overwritten, or if a new cell is being inserted, if the cursor is
    ** not pointing to an immediately adjacent cell, then move the cursor
    ** so that it does.
    */
    if( loc==0 && (flags & BTREE_SAVEPOSITION)==0 ){
      if( pX->nMem ){
        UnpackedRecord r;
        r.pKeyInfo = pCur->pKeyInfo;
        r.aMem = pX->aMem;
        r.nField = pX->nMem;
        r.default_rc = 0;
        r.errCode = 0;
        r.r1 = 0;
        r.r2 = 0;
        r.eqSeen = 0;
        rc = sqlite3BtreeMovetoUnpacked(pCur, &r, 0, flags!=0, &loc);
      }else{
        rc = btreeMoveto(pCur, pX->pKey, pX->nKey, flags!=0, &loc);
      }
      if( rc ) return rc;
    }

    /* If the cursor is currently pointing to an entry to be overwritten
    ** and the new content is the same as as the old, then use the
    ** overwrite optimization.
    */
    if( loc==0 ){
      getCellInfo(pCur);
      if( pCur->info.nKey==pX->nKey ){
        BtreePayload x2;
        x2.pData = pX->pKey;
        x2.nData = pX->nKey;
        x2.nZero = 0;
        return btreeOverwriteCell(pCur, &x2);
      }
    }

  }
  assert( pCur->eState==CURSOR_VALID || (pCur->eState==CURSOR_INVALID && loc) );

  pPage = pCur->pPage;
  assert( pPage->intKey || pX->nKey>=0 );
  assert( pPage->leaf || !pPage->intKey );
  if( pPage->nFree<0 ){
    rc = btreeComputeFreeSpace(pPage);
    if( rc ) return rc;
  }

  TRACE(("INSERT: table=%d nkey=%lld ndata=%d page=%d %s\n",
          pCur->pgnoRoot, pX->nKey, pX->nData, pPage->pgno,
          loc==0 ? "overwrite" : "new entry"));
  assert( pPage->isInit );
  newCell = pBt->pTmpSpace;
  assert( newCell!=0 );
  rc = fillInCell(pPage, newCell, pX, &szNew);
  if( rc ) goto end_insert;
  assert( szNew==pPage->xCellSize(pPage, newCell) );
  assert( szNew <= MX_CELL_SIZE(pBt) );
  idx = pCur->ix;
  if( loc==0 ){
    CellInfo info;
    assert( idx<pPage->nCell );
    rc = sqlite3PagerWrite(pPage->pDbPage);
    if( rc ){
      goto end_insert;
    }
    oldCell = findCell(pPage, idx);
    if( !pPage->leaf ){
      memcpy(newCell, oldCell, 4);
    }
    rc = clearCell(pPage, oldCell, &info);
    if( info.nSize==szNew && info.nLocal==info.nPayload 
     && (!ISAUTOVACUUM || szNew<pPage->minLocal)
    ){
      /* Overwrite the old cell with the new if they are the same size.
      ** We could also try to do this if the old cell is smaller, then add
      ** the leftover space to the free list.  But experiments show that
      ** doing that is no faster then skipping this optimization and just
      ** calling dropCell() and insertCell(). 
      **
      ** This optimization cannot be used on an autovacuum database if the
      ** new entry uses overflow pages, as the insertCell() call below is
      ** necessary to add the PTRMAP_OVERFLOW1 pointer-map entry.  */
      assert( rc==SQLITE_OK ); /* clearCell never fails when nLocal==nPayload */
      if( oldCell+szNew > pPage->aDataEnd ) return SQLITE_CORRUPT_BKPT;
      memcpy(oldCell, newCell, szNew);
      return SQLITE_OK;
    }
    dropCell(pPage, idx, info.nSize, &rc);
    if( rc ) goto end_insert;
  }else if( loc<0 && pPage->nCell>0 ){
    assert( pPage->leaf );
    idx = ++pCur->ix;
    pCur->curFlags &= ~BTCF_ValidNKey;
  }else{
    assert( pPage->leaf );
  }
  insertCell(pPage, idx, newCell, szNew, 0, 0, &rc);
  assert( pPage->nOverflow==0 || rc==SQLITE_OK );
  assert( rc!=SQLITE_OK || pPage->nCell>0 || pPage->nOverflow>0 );

  /* If no error has occurred and pPage has an overflow cell, call balance() 
  ** to redistribute the cells within the tree. Since balance() may move
  ** the cursor, zero the BtCursor.info.nSize and BTCF_ValidNKey
  ** variables.
  **
  ** Previous versions of SQLite called moveToRoot() to move the cursor
  ** back to the root page as balance() used to invalidate the contents
  ** of BtCursor.apPage[] and BtCursor.aiIdx[]. Instead of doing that,
  ** set the cursor state to "invalid". This makes common insert operations
  ** slightly faster.
  **
  ** There is a subtle but important optimization here too. When inserting
  ** multiple records into an intkey b-tree using a single cursor (as can
  ** happen while processing an "INSERT INTO ... SELECT" statement), it
  ** is advantageous to leave the cursor pointing to the last entry in
  ** the b-tree if possible. If the cursor is left pointing to the last
  ** entry in the table, and the next row inserted has an integer key
  ** larger than the largest existing key, it is possible to insert the
  ** row without seeking the cursor. This can be a big performance boost.
  */
  pCur->info.nSize = 0;
  if( pPage->nOverflow ){
    assert( rc==SQLITE_OK );
    pCur->curFlags &= ~(BTCF_ValidNKey);
    rc = balance(pCur);

    /* Must make sure nOverflow is reset to zero even if the balance()
    ** fails. Internal data structure corruption will result otherwise. 
    ** Also, set the cursor state to invalid. This stops saveCursorPosition()
    ** from trying to save the current position of the cursor.  */
    pCur->pPage->nOverflow = 0;
    pCur->eState = CURSOR_INVALID;
    if( (flags & BTREE_SAVEPOSITION) && rc==SQLITE_OK ){
      btreeReleaseAllCursorPages(pCur);
      if( pCur->pKeyInfo ){
        assert( pCur->pKey==0 );
        pCur->pKey = sqlite3Malloc( pX->nKey );
        if( pCur->pKey==0 ){
          rc = SQLITE_NOMEM;
        }else{
          memcpy(pCur->pKey, pX->pKey, pX->nKey);
        }
      }
      pCur->eState = CURSOR_REQUIRESEEK;
      pCur->nKey = pX->nKey;
    }
  }
  assert( pCur->iPage<0 || pCur->pPage->nOverflow==0 );

end_insert:
  return rc;
}